

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AStateProvider_A_FireBullets
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  AActor *pAVar2;
  undefined8 *puVar3;
  player_t *ppVar4;
  AWeapon *this;
  int iVar5;
  uint flags;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  PClass *pPVar10;
  PClass *pPVar11;
  PClassActor *pufftype;
  AActor *pAVar12;
  AActor *pAVar13;
  AActor *pAVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  APlayerPawn *this_00;
  int damage;
  bool bVar18;
  void *pvVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  void *pvVar23;
  double dVar24;
  PClassActor *local_130;
  DThinker *local_118;
  double local_d0;
  FName local_c0;
  FName local_bc;
  void *local_b8;
  void *pvStack_b0;
  void *local_a8;
  undefined8 uStack_a0;
  DAngle local_98;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  DAngle local_78;
  undefined1 local_70 [12];
  FName local_64;
  FName local_60;
  FSoundID local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  pPVar11 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003cde3d:
    pcVar17 = "(paramnum) < numparam";
    goto LAB_003cde6c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(APlayerPawn **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (APlayerPawn *)0x0) {
LAB_003cd4cf:
        this_00 = (APlayerPawn *)0x0;
        uVar16 = numparam;
      }
      else {
        pPVar10 = (this_00->super_AActor).super_DThinker.super_DObject.Class;
        if (pPVar10 == (PClass *)0x0) {
          iVar5 = (**(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this_00);
          pPVar10 = (PClass *)CONCAT44(extraout_var,iVar5);
          (this_00->super_AActor).super_DThinker.super_DObject.Class = pPVar10;
        }
        bVar18 = pPVar10 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar18;
        if (pPVar10 != pPVar11 && !bVar18) {
          do {
            pPVar10 = pPVar10->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar10 != (PClass *)0x0);
            if (pPVar10 == pPVar11) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        uVar16 = (uint)bVar18;
        if ((char)ret == '\0') {
          pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cde6c;
        }
      }
      pPVar11 = AStateProvider::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_003cde3d;
      if (param[1].field_0.field_3.Type == '\x03') {
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar10 = (PClass *)puVar3[1];
            if (pPVar10 == (PClass *)0x0) {
              pPVar10 = (PClass *)(**(code **)*puVar3)(puVar3,defaultparam,uVar16,ret);
              puVar3[1] = pPVar10;
            }
            bVar18 = pPVar10 != (PClass *)0x0;
            if (pPVar10 != pPVar11 && bVar18) {
              do {
                pPVar10 = pPVar10->ParentClass;
                bVar18 = pPVar10 != (PClass *)0x0;
                if (pPVar10 == pPVar11) break;
              } while (pPVar10 != (PClass *)0x0);
            }
            if (!bVar18) {
              pcVar17 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_003cde6c;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_003cde34;
        if (numparam < 3) goto LAB_003cde3d;
        if (param[2].field_0.field_3.Type != '\x03') {
          pcVar17 = "param[paramnum].Type == REGT_POINTER";
          goto LAB_003cde6c;
        }
        if (numparam == 3) {
          pcVar17 = "(paramnum) < numparam";
LAB_003cde94:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x748,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar17 = "param[paramnum].Type == REGT_FLOAT";
          goto LAB_003cde94;
        }
        if ((uint)numparam < 5) {
          pcVar17 = "(paramnum) < numparam";
LAB_003cdebc:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x749,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[4].field_0.field_3.Type != '\x01') {
          pcVar17 = "param[paramnum].Type == REGT_FLOAT";
          goto LAB_003cdebc;
        }
        if (numparam == 5) {
          pcVar17 = "(paramnum) < numparam";
LAB_003cdee4:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74a,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar17 = "param[paramnum].Type == REGT_INT";
          goto LAB_003cdee4;
        }
        if ((uint)numparam < 7) {
          pcVar17 = "(paramnum) < numparam";
LAB_003cdf0c:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74b,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[6].field_0.field_3.Type != '\0') {
          pcVar17 = "param[paramnum].Type == REGT_INT";
          goto LAB_003cdf0c;
        }
        pvVar19 = param[2].field_0.field_1.a;
        local_b8 = param[3].field_0.field_1.a;
        pvStack_b0 = (void *)0x0;
        local_a8 = param[4].field_0.field_1.a;
        iVar5 = param[5].field_0.i;
        damage = param[6].field_0.i;
        if (numparam == 7) {
          param = defaultparam->Array;
          if (param[7].field_0.field_3.Type != '\x03') {
LAB_003cdf8a:
            pcVar17 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003cdf91:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74c,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pufftype = (PClassActor *)param[7].field_0.field_1.a;
          if (param[7].field_0.field_1.atag != 1) {
            if (pufftype != (PClassActor *)0x0) goto LAB_003cdf8a;
            pufftype = (PClassActor *)0x0;
          }
LAB_003cd67a:
          if (param[8].field_0.field_3.Type != '\0') {
            pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cdfb9:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74d,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar16 = param[8].field_0.i;
LAB_003cd68f:
          if (param[9].field_0.field_3.Type != '\x01') {
            pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cdf72:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74e,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          dVar24 = param[9].field_0.f;
LAB_003cd6a6:
          if (param[10].field_0.field_3.Type != '\x03') {
LAB_003cde46:
            pcVar17 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003cde4d:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x74f,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_130 = (PClassActor *)param[10].field_0.field_1.a;
          if (param[10].field_0.field_1.atag != 1) {
            if (local_130 != (PClassActor *)0x0) goto LAB_003cde46;
            local_130 = (PClassActor *)0x0;
          }
LAB_003cd6d0:
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cdf53:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x750,
                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_d0 = param[0xb].field_0.f;
        }
        else {
          if ((param[7].field_0.field_3.Type != '\x03') ||
             (pufftype = (PClassActor *)param[7].field_0.field_1.a,
             pufftype != (PClassActor *)0x0 && param[7].field_0.field_1.atag != 1)) {
            pcVar17 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003cdf91;
          }
          if ((uint)numparam < 9) {
            param = defaultparam->Array;
            goto LAB_003cd67a;
          }
          if (param[8].field_0.field_3.Type != '\0') {
            pcVar17 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003cdfb9;
          }
          uVar16 = param[8].field_0.i;
          if (numparam == 9) {
            param = defaultparam->Array;
            goto LAB_003cd68f;
          }
          if (param[9].field_0.field_3.Type != '\x01') {
            pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003cdf72;
          }
          dVar24 = param[9].field_0.f;
          if ((uint)numparam < 0xb) {
            param = defaultparam->Array;
            goto LAB_003cd6a6;
          }
          if ((param[10].field_0.field_3.Type != '\x03') ||
             (local_130 = (PClassActor *)param[10].field_0.field_1.a,
             local_130 != (PClassActor *)0x0 && param[10].field_0.field_1.atag != 1)) {
            pcVar17 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003cde4d;
          }
          if (numparam == 0xb) {
            param = defaultparam->Array;
            goto LAB_003cd6d0;
          }
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003cdf53;
          }
          local_d0 = param[0xb].field_0.f;
          if (0xc < (uint)numparam) {
            if (param[0xc].field_0.field_3.Type != '\x01') {
              pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
              goto LAB_003cdf34;
            }
            goto LAB_003cd703;
          }
          param = defaultparam->Array;
        }
        if (param[0xc].field_0.field_3.Type != '\x01') {
          pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cdf34:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x751,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
LAB_003cd703:
        ppVar4 = (this_00->super_AActor).player;
        if (ppVar4 != (player_t *)0x0) {
          dVar1 = param[0xc].field_0.f;
          this = ppVar4->ReadyWeapon;
          uStack_a0 = 0;
          if ((((pvVar19 != (void *)0x0 & (byte)uVar16 & this != (AWeapon *)0x0) != 1) ||
              (*(int *)((long)pvVar19 + 8) != 1)) ||
             (bVar18 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1), bVar18)) {
            local_118 = (DThinker *)0x0;
            if ((uVar16 & 0x10) == 0) {
              APlayerPawn::PlayAttacking2(this_00);
            }
            if ((uVar16 & 8) == 0) {
              P_BulletSlope((AActor *)local_70,(FTranslatedLineTarget *)this_00,0);
              local_118 = (DThinker *)CONCAT44(local_70._4_4_,local_70._0_4_);
            }
            dVar24 = (double)(~-(ulong)(dVar24 == 0.0) & (ulong)dVar24 |
                             -(ulong)(dVar24 == 0.0) & 0x40c0000000000000);
            pAVar2 = (AActor *)(this_00->super_AActor).Angles.Yaw.Degrees;
            if (pufftype == (PClassActor *)0x0) {
              local_70._0_4_ = 0x40;
              pPVar11 = PClass::FindClass((FName *)local_70);
              pufftype = dyn_cast<PClassActor>((DObject *)pPVar11);
            }
            if (this != (AWeapon *)0x0) {
              local_5c.ID = (this->super_AStateProvider).super_AInventory.super_AActor.AttackSound.
                            super_FSoundID.ID;
              S_Sound(&this_00->super_AActor,1,&local_5c,1.0,1.0);
            }
            flags = uVar16 >> 4 & 2;
            if ((iVar5 == 0) || ((iVar5 == 1 && (ppVar4->refire == 0)))) {
              if ((uVar16 & 2) == 0) {
                uVar6 = FRandom::GenRand32(&pr_cwbullet);
                damage = damage * (uint)(byte)((char)uVar6 + (char)((uVar6 & 0xff) / 3) * -3 + 1);
              }
              local_40.Degrees = (double)local_118;
              local_60.Index = 0xcd;
              local_38.Degrees = (double)pAVar2;
              pAVar12 = P_LineAttack(&this_00->super_AActor,&local_38,dVar24,&local_40,damage,
                                     &local_60,pufftype,flags,(FTranslatedLineTarget *)0x0,
                                     (int *)0x0);
              if (local_130 != (PClassActor *)0x0) {
                dVar20 = FFastTrig::cos(&fasttrig,
                                        ((this_00->super_AActor).Angles.Yaw.Degrees + -90.0) *
                                        11930464.711111112 + 6755399441055744.0);
                dVar21 = FFastTrig::sin(&fasttrig,dVar20 * dVar1);
                local_48.Degrees = (double)pAVar2;
                pAVar13 = P_SpawnPlayerMissile
                                    (&this_00->super_AActor,dVar20 * dVar1,dVar1 * dVar21,local_d0,
                                     local_130,&local_48,(FTranslatedLineTarget *)0x0,(AActor **)0x0
                                     ,false,true,0);
                if (pAVar13 != (AActor *)0x0) {
                  pAVar14 = pAVar12;
                  if (pAVar12 == (AActor *)0x0) {
                    local_58.Degrees = (double)local_118;
                    local_64.Index = 0xcd;
                    local_50.Degrees = (double)pAVar2;
                    pAVar14 = P_LineAttack(&this_00->super_AActor,&local_50,dVar24,&local_58,0,
                                           &local_64,pufftype,flags | 8,(FTranslatedLineTarget *)0x0
                                           ,(int *)0x0);
                  }
                  AimBulletMissile(pAVar13,pAVar14,uVar16,pAVar12 == (AActor *)0x0,false);
                }
              }
            }
            else {
              iVar15 = 1;
              if (-1 < iVar5) {
                iVar15 = iVar5;
              }
              pvStack_b0 = local_a8;
              do {
                pvVar19 = local_b8;
                pvVar23 = pvStack_b0;
                if ((uVar16 & 4) == 0) {
                  uVar6 = FRandom::GenRand32(&pr_cwbullet);
                  uVar7 = FRandom::GenRand32(&pr_cwbullet);
                  uVar8 = FRandom::GenRand32(&pr_cwbullet);
                  uVar9 = FRandom::GenRand32(&pr_cwbullet);
                  auVar22._0_8_ = (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff));
                  auVar22._8_8_ = (double)(int)((uVar8 & 0xff) - (uVar9 & 0xff));
                  auVar22 = divpd(auVar22,_DAT_005e1950);
                  pvVar19 = (void *)(auVar22._0_8_ * (double)local_b8);
                  pvVar23 = (void *)(auVar22._8_8_ * (double)pvStack_b0);
                }
                iVar5 = damage;
                if ((uVar16 & 2) == 0) {
                  uVar6 = FRandom::GenRand32(&pr_cwbullet);
                  iVar5 = (uint)(byte)((char)uVar6 + (char)((uVar6 & 0xff) / 3) * -3 + 1) * damage;
                }
                local_a8 = (void *)((double)pAVar2 + (double)pvVar19);
                local_bc.Index = 0xcd;
                local_80.Degrees = (double)pvVar23 + (double)local_118;
                local_78.Degrees = (double)local_a8;
                pAVar12 = P_LineAttack(&this_00->super_AActor,&local_78,dVar24,&local_80,iVar5,
                                       &local_bc,pufftype,flags,(FTranslatedLineTarget *)0x0,
                                       (int *)0x0);
                if (local_130 != (PClassActor *)0x0) {
                  dVar20 = FFastTrig::cos(&fasttrig,
                                          ((this_00->super_AActor).Angles.Yaw.Degrees + -90.0) *
                                          11930464.711111112 + 6755399441055744.0);
                  dVar21 = FFastTrig::sin(&fasttrig,dVar20 * dVar1);
                  local_88.Degrees = (double)local_a8;
                  pAVar13 = P_SpawnPlayerMissile
                                      (&this_00->super_AActor,dVar20 * dVar1,dVar21 * dVar1,local_d0
                                       ,local_130,&local_88,(FTranslatedLineTarget *)0x0,
                                       (AActor **)0x0,false,true,0);
                  if (pAVar13 != (AActor *)0x0) {
                    pAVar14 = pAVar12;
                    if (pAVar12 == (AActor *)0x0) {
                      local_90.Degrees = (double)local_a8;
                      local_c0.Index = 0xcd;
                      local_98.Degrees = (double)pvVar23 + (double)local_118;
                      pAVar14 = P_LineAttack(&this_00->super_AActor,&local_90,dVar24,&local_98,0,
                                             &local_c0,pufftype,flags + 8,
                                             (FTranslatedLineTarget *)0x0,(int *)0x0);
                    }
                    AimBulletMissile(pAVar13,pAVar14,uVar16,pAVar12 == (AActor *)0x0,false);
                  }
                }
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
        }
        return 0;
      }
    }
    else if (this_00 == (APlayerPawn *)0x0) goto LAB_003cd4cf;
  }
LAB_003cde34:
  pcVar17 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003cde6c:
  __assert_fail(pcVar17,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x747,
                "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireBullets)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_INT_DEF	(flags);
	PARAM_FLOAT_DEF	(range);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	if (!self->player) return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & FBF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if ((flags & FBF_USEAMMO) && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}
	
	if (range == 0)	range = PLAYERMISSILERANGE;

	if (!(flags & FBF_NOFLASH)) static_cast<APlayerPawn *>(self)->PlayAttacking2 ();

	if (!(flags & FBF_NOPITCH)) bslope = P_BulletSlope(self);
	bangle = self->Angles.Yaw;

	if (pufftype == NULL) pufftype = PClass::FindActor(NAME_BulletPuff);

	if (weapon != NULL)
	{
		S_Sound(self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
	}

	if ((numbullets == 1 && !player->refire) || numbullets == 0)
	{
		int damage = damageperbullet;

		if (!(flags & FBF_NORANDOM))
			damage *= ((pr_cwbullet()%3)+1);

		AActor *puff = P_LineAttack(self, bangle, range, bslope, damage, NAME_Hitscan, pufftype, laflags);

		if (missile != nullptr)
		{
			bool temp = false;
			DAngle ang = self->Angles.Yaw - 90;
			DVector2 ofs = ang.ToVector(Spawnofs_xy);
			AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, bangle, nullptr, nullptr, false, true);
			if (proj)
			{
				if (!puff)
				{
					temp = true;
					puff = P_LineAttack(self, bangle, range, bslope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
				}
				AimBulletMissile(proj, puff, flags, temp, false);
			}
		}
	}
	else 
	{
		if (numbullets < 0)
			numbullets = 1;
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & FBF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & FBF_NORANDOM))
				damage *= ((pr_cwbullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);

			if (missile != nullptr)
			{
				bool temp = false;
				DAngle ang = self->Angles.Yaw - 90;
				DVector2 ofs = ang.ToVector(Spawnofs_xy);
				AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, angle, nullptr, nullptr, false, true);
				if (proj)
				{
					if (!puff)
					{
						temp = true;
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					AimBulletMissile(proj, puff, flags, temp, false);
				}
			}
		}
	}
	return 0;
}